

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

bool __thiscall
Rml::DataInterpreter::ExtractArgumentsFromStack
          (DataInterpreter *this,Vector<Variant> *out_arguments)

{
  iterator __first;
  pointer pVVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  String local_40;
  
  local_40._M_dataplus._M_p._0_4_ = 0xffffffff;
  Variant::GetInto<int,_0>(&this->R,(int *)&local_40);
  uVar4 = (ulong)(int)local_40._M_dataplus._M_p;
  if ((long)uVar4 < 0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Invalid number of arguments.","");
    bVar2 = Error(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return bVar2;
    }
  }
  else {
    pVVar1 = (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar3 = ((long)pVVar1 -
             (long)(this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    if (uVar4 <= uVar3) {
      __first._M_current = pVVar1 + -uVar4;
      ::std::vector<Rml::Variant,std::allocator<Rml::Variant>>::
      _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<Rml::Variant*,std::vector<Rml::Variant,std::allocator<Rml::Variant>>>>>
                ((vector<Rml::Variant,std::allocator<Rml::Variant>> *)out_arguments,
                 (out_arguments->super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>).
                 _M_impl.super__Vector_impl_data._M_finish,__first._M_current);
      ::std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>::_M_erase
                (&this->stack,__first,
                 (this->stack).super__Vector_base<Rml::Variant,_std::allocator<Rml::Variant>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      return true;
    }
    CreateString_abi_cxx11_
              (&local_40,"Cannot pop %d arguments, stack contains only %zu elements.",uVar4,uVar3);
    bVar2 = Error(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return bVar2;
    }
  }
  operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  return bVar2;
}

Assistant:

bool ExtractArgumentsFromStack(Vector<Variant>& out_arguments)
	{
		int num_arguments = R.Get<int>(-1);
		if (num_arguments < 0)
			return Error("Invalid number of arguments.");
		if (stack.size() < size_t(num_arguments))
			return Error(CreateString("Cannot pop %d arguments, stack contains only %zu elements.", num_arguments, stack.size()));

		const auto it_stack_begin_arguments = stack.end() - num_arguments;
		out_arguments.insert(out_arguments.end(), std::make_move_iterator(it_stack_begin_arguments), std::make_move_iterator(stack.end()));

		stack.erase(it_stack_begin_arguments, stack.end());
		return true;
	}